

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O1

void __thiscall
glcts::MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test::deinit
          (MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->fbo_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,&this->fbo_id);
    this->fbo_id = 0;
  }
  if (this->to_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->to_id);
    this->to_id = 0;
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &fbo_id);

		fbo_id = 0;
	}

	if (to_id != 0)
	{
		gl.deleteTextures(1, &to_id);

		to_id = 0;
	}

	/* Call base class' deinit() */
	TestCase::deinit();
}